

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode sasl_create_plain_message
                   (SessionHandle *data,char *userp,char *passwdp,char **outptr,size_t *outlen)

{
  CURLcode CVar1;
  size_t __n;
  size_t __n_00;
  char *inputbuff;
  size_t insize;
  
  __n = strlen(userp);
  __n_00 = strlen(passwdp);
  insize = __n_00 + __n * 2 + 2;
  inputbuff = (char *)(*Curl_cmalloc)(insize);
  if (inputbuff == (char *)0x0) {
    *outlen = 0;
    *outptr = (char *)0x0;
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    memcpy(inputbuff,userp,__n);
    inputbuff[__n] = '\0';
    memcpy(inputbuff + __n + 1,userp,__n);
    inputbuff[__n * 2 + 1] = '\0';
    memcpy(inputbuff + __n * 2 + 2,passwdp,__n_00);
    CVar1 = Curl_base64_encode(data,inputbuff,insize,outptr,outlen);
    (*Curl_cfree)(inputbuff);
  }
  return CVar1;
}

Assistant:

static CURLcode sasl_create_plain_message(struct SessionHandle *data,
                                          const char *userp,
                                          const char *passwdp,
                                          char **outptr, size_t *outlen)
{
  CURLcode result;
  char *plainauth;
  size_t ulen;
  size_t plen;

  ulen = strlen(userp);
  plen = strlen(passwdp);

  plainauth = malloc(2 * ulen + plen + 2);
  if(!plainauth) {
    *outlen = 0;
    *outptr = NULL;
    return CURLE_OUT_OF_MEMORY;
  }

  /* Calculate the reply */
  memcpy(plainauth, userp, ulen);
  plainauth[ulen] = '\0';
  memcpy(plainauth + ulen + 1, userp, ulen);
  plainauth[2 * ulen + 1] = '\0';
  memcpy(plainauth + 2 * ulen + 2, passwdp, plen);

  /* Base64 encode the reply */
  result = Curl_base64_encode(data, plainauth, 2 * ulen + plen + 2, outptr,
                              outlen);
  free(plainauth);
  return result;
}